

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::detach_helper
          (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *this)

{
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *pDVar1;
  Data *pDVar2;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *this_00;
  undefined8 *puVar3;
  size_t sVar4;
  
  pDVar1 = this->d;
  this_00 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
             *)operator_new(0x28);
  if (pDVar1 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                 *)0x0) {
    (this_00->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
    this_00->size = 0;
    this_00->numBuckets = 0x80;
    puVar3 = (undefined8 *)operator_new__(0x98);
    *puVar3 = 1;
    puVar3[0x11] = 0;
    *(undefined2 *)(puVar3 + 0x12) = 0;
    *(undefined4 *)(puVar3 + 1) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0xc) = 0xffffffff;
    *(undefined4 *)(puVar3 + 2) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x14) = 0xffffffff;
    *(undefined4 *)(puVar3 + 3) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x1c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 4) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x24) = 0xffffffff;
    *(undefined4 *)(puVar3 + 5) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x2c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 6) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x34) = 0xffffffff;
    *(undefined4 *)(puVar3 + 7) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x3c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 8) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x44) = 0xffffffff;
    *(undefined4 *)(puVar3 + 9) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x4c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 10) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x54) = 0xffffffff;
    *(undefined4 *)(puVar3 + 0xb) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x5c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 0xc) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 100) = 0xffffffff;
    *(undefined4 *)(puVar3 + 0xd) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x6c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 0xe) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x74) = 0xffffffff;
    *(undefined4 *)(puVar3 + 0xf) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x7c) = 0xffffffff;
    *(undefined4 *)(puVar3 + 0x10) = 0xffffffff;
    *(undefined4 *)((long)puVar3 + 0x84) = 0xffffffff;
    this_00->spans = (Span *)(puVar3 + 1);
    sVar4 = QHashSeed::globalSeed();
    this_00->seed = sVar4;
  }
  else {
    QHashPrivate::
    Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
    ::Data(this_00,pDVar1);
    pDVar2 = this->d;
    if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        pDVar1 = this->d;
        if (pDVar1 != (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                       *)0x0) {
          QHashPrivate::
          Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
          ::~Data(pDVar1);
        }
        operator_delete(pDVar1,0x28);
      }
    }
  }
  this->d = this_00;
  return;
}

Assistant:

void detach_helper()
    {
        if (!d) {
            d = new Data;
            return;
        }
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        d = dd;
    }